

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionRequestReliablePdu.cpp
# Opt level: O2

int __thiscall DIS::ActionRequestReliablePdu::getMarshalledSize(ActionRequestReliablePdu *this)

{
  pointer pFVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  FixedDatum listElement;
  
  iVar3 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  iVar3 = iVar3 + 0x14;
  lVar6 = 8;
  for (uVar5 = 0;
      pFVar1 = (this->_fixedDatumRecords).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_fixedDatumRecords).
                            super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar5 = uVar5 + 1) {
    listElement._vptr_FixedDatum = (_func_int **)&PTR__FixedDatum_001c1c68;
    listElement._8_8_ = *(undefined8 *)((long)&pFVar1->_vptr_FixedDatum + lVar6);
    iVar4 = FixedDatum::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar4;
    FixedDatum::~FixedDatum(&listElement);
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 0;
  for (uVar5 = 0;
      pVVar2 = (this->_variableDatumRecords).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->_variableDatumRecords).
                             super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x30);
      uVar5 = uVar5 + 1) {
    VariableDatum::VariableDatum
              ((VariableDatum *)&listElement,
               (VariableDatum *)((long)&pVVar2->_vptr_VariableDatum + lVar6));
    iVar4 = VariableDatum::getMarshalledSize((VariableDatum *)&listElement);
    iVar3 = iVar3 + iVar4;
    VariableDatum::~VariableDatum((VariableDatum *)&listElement);
    lVar6 = lVar6 + 0x30;
  }
  return iVar3;
}

Assistant:

int ActionRequestReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 1;  // _requiredReliabilityService
   marshalSize = marshalSize + 2;  // _pad1
   marshalSize = marshalSize + 1;  // _pad2
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 4;  // _actionID
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatumRecords.size(); idx++)
   {
        FixedDatum listElement = _fixedDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatumRecords.size(); idx++)
   {
        VariableDatum listElement = _variableDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}